

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void rsg::anon_unknown_0::setInfiniteRange(ValueRangeAccess valueRange)

{
  Type TVar1;
  Exception *this;
  int ndx;
  int iVar2;
  StridedValueAccess<1> SVar3;
  allocator<char> local_49;
  string local_48;
  
  TVar1 = (valueRange.super_ConstValueRangeAccess.m_type)->m_baseType;
  if (TVar1 == TYPE_BOOL) {
    for (iVar2 = 0; iVar2 < (valueRange.super_ConstValueRangeAccess.m_type)->m_numElements;
        iVar2 = iVar2 + 1) {
      local_48._M_dataplus._M_p = (pointer)valueRange.super_ConstValueRangeAccess.m_type;
      local_48._M_string_length = (size_type)valueRange.super_ConstValueRangeAccess.m_min;
      SVar3 = StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_48,iVar2);
      (SVar3.super_ConstStridedValueAccess<1>.m_value)->intVal = 0;
      local_48._M_dataplus._M_p = (pointer)valueRange.super_ConstValueRangeAccess.m_type;
      local_48._M_string_length = (size_type)valueRange.super_ConstValueRangeAccess.m_max;
      SVar3 = StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_48,iVar2);
      (SVar3.super_ConstStridedValueAccess<1>.m_value)->intVal = 1;
    }
  }
  else if (TVar1 == TYPE_INT) {
    for (iVar2 = 0; iVar2 < (valueRange.super_ConstValueRangeAccess.m_type)->m_numElements;
        iVar2 = iVar2 + 1) {
      local_48._M_dataplus._M_p = (pointer)valueRange.super_ConstValueRangeAccess.m_type;
      local_48._M_string_length = (size_type)valueRange.super_ConstValueRangeAccess.m_min;
      SVar3 = StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_48,iVar2);
      (SVar3.super_ConstStridedValueAccess<1>.m_value)->intVal = -0x80000000;
      local_48._M_dataplus._M_p = (pointer)valueRange.super_ConstValueRangeAccess.m_type;
      local_48._M_string_length = (size_type)valueRange.super_ConstValueRangeAccess.m_max;
      SVar3 = StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_48,iVar2);
      (SVar3.super_ConstStridedValueAccess<1>.m_value)->intVal = 0x7fffffff;
    }
  }
  else {
    if (TVar1 != TYPE_FLOAT) {
      this = (Exception *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"setInfiniteRange(): unsupported type",&local_49);
      Exception::Exception(this,&local_48);
      __cxa_throw(this,&Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    for (iVar2 = 0; iVar2 < (valueRange.super_ConstValueRangeAccess.m_type)->m_numElements;
        iVar2 = iVar2 + 1) {
      local_48._M_dataplus._M_p = (pointer)valueRange.super_ConstValueRangeAccess.m_type;
      local_48._M_string_length = (size_type)valueRange.super_ConstValueRangeAccess.m_min;
      SVar3 = StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_48,iVar2);
      (SVar3.super_ConstStridedValueAccess<1>.m_value)->intVal = -0x800000;
      local_48._M_dataplus._M_p = (pointer)valueRange.super_ConstValueRangeAccess.m_type;
      local_48._M_string_length = (size_type)valueRange.super_ConstValueRangeAccess.m_max;
      SVar3 = StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_48,iVar2);
      (SVar3.super_ConstStridedValueAccess<1>.m_value)->intVal = 0x7f800000;
    }
  }
  return;
}

Assistant:

void setInfiniteRange (ValueRangeAccess valueRange)
{
	const VariableType& type = valueRange.getType();

	switch (type.getBaseType())
	{
		case VariableType::TYPE_BOOL:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				valueRange.getMin().component(ndx) = Scalar::min<bool>();
				valueRange.getMax().component(ndx) = Scalar::max<bool>();
			}
			break;

		case VariableType::TYPE_INT:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				valueRange.getMin().component(ndx) = Scalar::min<int>();
				valueRange.getMax().component(ndx) = Scalar::max<int>();
			}
			break;

		case VariableType::TYPE_FLOAT:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				valueRange.getMin().component(ndx) = Scalar::min<float>();
				valueRange.getMax().component(ndx) = Scalar::max<float>();
			}
			break;

		default:
			DE_ASSERT(DE_FALSE);
			throw Exception("setInfiniteRange(): unsupported type");
	}
}